

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

bool __thiscall
cmGeneratorTarget::GetBuildRPATH(cmGeneratorTarget *this,string *config,string *rpath)

{
  bool bVar1;
  allocator<char> local_41;
  string local_40;
  string *local_20;
  string *rpath_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  local_20 = rpath;
  rpath_local = config;
  config_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"BUILD_RPATH",&local_41);
  bVar1 = GetRPATH(this,config,&local_40,local_20);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  return bVar1;
}

Assistant:

bool cmGeneratorTarget::GetBuildRPATH(const std::string& config,
                                      std::string& rpath) const
{
  return this->GetRPATH(config, "BUILD_RPATH", rpath);
}